

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

optional<PSEngine::TurnHistory> * __thiscall
PSEngine::receive_input
          (optional<PSEngine::TurnHistory> *__return_storage_ptr__,PSEngine *this,InputType p_input)

{
  InputType p_enum_value;
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *this_00;
  reference pCVar4;
  element_type *peVar5;
  shared_ptr<CompiledGame::Object> local_1e0;
  reference local_1d0;
  pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *pair;
  iterator __end2;
  iterator __begin2;
  map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
  *__range2;
  Cell *cell;
  iterator __end1;
  iterator __begin1;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *__range1;
  string local_188 [32];
  string local_168 [36];
  ObjectMoveType local_144;
  undefined1 local_140 [4];
  ObjectMoveType move_type;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8 [55];
  allocator<char> local_71;
  string local_70;
  Operation local_50;
  InputType local_1c;
  PSEngine *pPStack_18;
  InputType p_input_local;
  PSEngine *this_local;
  
  local_1c = p_input;
  pPStack_18 = this;
  this_local = (PSEngine *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  Operation::Operation(&local_50,Input,p_input,-1,&local_70);
  std::vector<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>::push_back
            (&this->m_operation_history,&local_50);
  Operation::~Operation(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  if ((int)(this->m_config).log_verbosity < 3) {
    peVar3 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->m_logger);
    std::__cxx11::string::string(local_a8,(string *)&m_engine_log_cat_abi_cxx11_);
    p_enum_value = local_1c;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>_>
           *)local_140,&to_input_type_abi_cxx11_);
    enum_to_str<PSEngine::InputType>
              (&local_110,p_enum_value,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>_>
                *)local_140);
    std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
              (&local_e8,(optional<std::__cxx11::string> *)&local_110,(char (*) [6])"ERROR");
    std::operator+(&local_c8,"Received input : ",&local_e8);
    (*peVar3->_vptr_PSLogger[2])(peVar3,2,local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_110);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>_>
            *)local_140);
    std::__cxx11::string::~string(local_a8);
  }
  this->m_last_input = local_1c;
  local_144 = 0;
  switch(local_1c) {
  case Up:
    local_144 = Up;
    break;
  case Down:
    local_144 = Down;
    break;
  case Left:
    local_144 = Left;
    break;
  case Right:
    local_144 = Right;
    break;
  case Action:
    local_144 = Action;
    break;
  default:
    if ((int)(this->m_config).log_verbosity < 5) {
      peVar3 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&this->m_logger);
      std::__cxx11::string::string(local_168,(string *)&m_engine_log_cat_abi_cxx11_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_188,"invalid input type.",(allocator<char> *)((long)&__range1 + 7));
      (*peVar3->_vptr_PSLogger[2])(peVar3,4,local_168,local_188);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      std::__cxx11::string::~string(local_168);
      if (((this->m_config).log_operation_history_after_error & 1U) != 0) {
        print_operation_history(this);
      }
    }
    std::optional<PSEngine::TurnHistory>::optional(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  this_00 = &(this->m_current_level).cells;
  __end1 = std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::begin(this_00);
  cell = (Cell *)std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
                                     *)&cell), bVar1) {
    pCVar4 = __gnu_cxx::
             __normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
             ::operator*(&__end1);
    __end2 = std::
             map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
             ::begin(&pCVar4->objects);
    pair = (pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *)
           std::
           map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
           ::end(&pCVar4->objects);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&pair), bVar1) {
      local_1d0 = std::
                  _Rb_tree_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>
                  ::operator*(&__end2);
      std::weak_ptr<CompiledGame::Object>::lock((weak_ptr<CompiledGame::Object> *)&local_1e0);
      peVar5 = std::
               __shared_ptr_access<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_1e0);
      uVar2 = (*peVar5->_vptr_Object[7])(peVar5,local_1d0);
      std::shared_ptr<CompiledGame::Object>::~shared_ptr(&local_1e0);
      if ((uVar2 & 1) != 0) {
        local_1d0->second = local_144;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
    ::operator++(&__end1);
  }
  next_turn(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

optional<PSEngine::TurnHistory> PSEngine::receive_input(InputType p_input)
{
    m_operation_history.push_back(Operation(OperationType::Input,p_input));

    PS_LOG("Received input : " + enum_to_str(p_input,to_input_type).value_or("ERROR"));

    m_last_input = p_input;

    ObjectMoveType move_type = ObjectMoveType::None;
    switch (p_input)
    {
    case InputType::Up:
        move_type = ObjectMoveType::Up;
        break;
    case InputType::Down:
        move_type = ObjectMoveType::Down;
        break;
    case InputType::Left:
        move_type = ObjectMoveType::Left;
        break;
    case InputType::Right:
        move_type = ObjectMoveType::Right;
        break;
    case InputType::Action:
        move_type = ObjectMoveType::Action;
        break;
    default:
        PS_LOG_ERROR("invalid input type.");
        return nullopt;
    }

    //marking player with input
    for(Cell& cell : m_current_level.cells)
    {
        for(auto& pair :cell.objects)
        {
            if(m_compiled_game.player_object.lock()->defines(pair.first))
            {
                pair.second = move_type;
            }
        }
    }

    return next_turn();
}